

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

void Gia_Iso2ManCheckIsoClassOne
               (Gia_Man_t *p,Vec_Int_t *vClass,Vec_Int_t *vRoots,Vec_Int_t *vVec0,Vec_Int_t *vVec1,
               Vec_Int_t *vMap0,Vec_Int_t *vMap1,Vec_Int_t *vNewClass)

{
  int iVar1;
  int iVar2;
  int local_44;
  int local_40;
  int iPo;
  int k;
  int i;
  Vec_Int_t *vMap0_local;
  Vec_Int_t *vVec1_local;
  Vec_Int_t *vVec0_local;
  Vec_Int_t *vRoots_local;
  Vec_Int_t *vClass_local;
  Gia_Man_t *p_local;
  
  local_40 = 1;
  _k = vMap0;
  vMap0_local = vVec1;
  vVec1_local = vVec0;
  vVec0_local = vRoots;
  vRoots_local = vClass;
  vClass_local = (Vec_Int_t *)p;
  Vec_IntClear(vNewClass);
  iVar1 = Vec_IntSize(vRoots_local);
  if (1 < iVar1) {
    iVar1 = Vec_IntSize(vRoots_local);
    if (iVar1 < 2) {
      __assert_fail("Vec_IntSize(vClass) > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso2.c"
                    ,0x267,
                    "void Gia_Iso2ManCheckIsoClassOne(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    local_44 = Vec_IntEntry(vRoots_local,0);
    Gia_Iso2ManCollectOrder((Gia_Man_t *)vClass_local,&local_44,1,vVec0_local,vVec1_local,_k);
    for (iPo = 1; iVar1 = iPo, iVar2 = Vec_IntSize(vRoots_local), iVar1 < iVar2; iPo = iPo + 1) {
      local_44 = Vec_IntEntry(vRoots_local,iPo);
      Gia_Iso2ManCollectOrder((Gia_Man_t *)vClass_local,&local_44,1,vVec0_local,vMap0_local,vMap1);
      iVar1 = Vec_IntSize(vVec1_local);
      iVar2 = Vec_IntSize(vMap0_local);
      if ((iVar1 == iVar2) &&
         (iVar2 = Gia_Iso2ManCheckIsoPair
                            ((Gia_Man_t *)vClass_local,vVec1_local,vMap0_local,_k,vMap1),
         iVar1 = local_40, iVar2 != 0)) {
        local_40 = local_40 + 1;
        Vec_IntWriteEntry(vRoots_local,iVar1,local_44);
      }
      else {
        Vec_IntPush(vNewClass,local_44);
      }
    }
    Vec_IntShrink(vRoots_local,local_40);
  }
  return;
}

Assistant:

void Gia_Iso2ManCheckIsoClassOne( Gia_Man_t * p, Vec_Int_t * vClass, Vec_Int_t * vRoots, Vec_Int_t * vVec0, Vec_Int_t * vVec1, Vec_Int_t * vMap0, Vec_Int_t * vMap1, Vec_Int_t * vNewClass )
{
    int i, k = 1, iPo;
    Vec_IntClear( vNewClass );
    if ( Vec_IntSize(vClass) <= 1 )
        return;
    assert( Vec_IntSize(vClass) > 1 );
    iPo = Vec_IntEntry( vClass, 0 );
    Gia_Iso2ManCollectOrder( p, &iPo, 1, vRoots, vVec0, vMap0 );
    Vec_IntForEachEntryStart( vClass, iPo, i, 1 )
    {
        Gia_Iso2ManCollectOrder( p, &iPo, 1, vRoots, vVec1, vMap1 );
        if ( Vec_IntSize(vVec0) == Vec_IntSize(vVec1) && Gia_Iso2ManCheckIsoPair(p, vVec0, vVec1, vMap0, vMap1) )
            Vec_IntWriteEntry( vClass, k++, iPo );
        else
            Vec_IntPush( vNewClass, iPo );
    }
    Vec_IntShrink( vClass, k );
}